

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O0

int __thiscall gdsForge::gdsCopyFile(gdsForge *this,string *fileName)

{
  short sVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  ushort *puVar7;
  void *__ptr;
  int *arrInt;
  _Self local_2a8;
  _Self local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  byte local_271;
  undefined1 local_270 [7];
  uint8_t i;
  string strName;
  bool firstLine;
  bool cpEN;
  uint32_t hexKey;
  uint32_t sizeBlk;
  char *readBlk;
  string local_228 [8];
  ifstream gdsFileIn;
  string *fileName_local;
  gdsForge *this_local;
  
  poVar6 = std::operator<<((ostream *)&std::cout,"Copying GDS binaries from \"");
  poVar6 = std::operator<<(poVar6,(string *)fileName);
  poVar6 = std::operator<<(poVar6,"\"");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::ifstream::ifstream(local_228);
  std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_228,(_Ios_Openmode)fileName);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"FAILED to open GDS file \"");
    poVar6 = std::operator<<(poVar6,(string *)fileName);
    poVar6 = std::operator<<(poVar6,"\"");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 1;
  }
  else {
    strName.field_2._M_local_buf[0xf] = '\0';
    strName.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string((string *)local_270);
    if (gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_ == '\0') {
      iVar4 = __cxa_guard_acquire(&gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_);
      if (iVar4 != 0) {
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set(&gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_);
        __cxa_atexit(std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::~set,&gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_);
      }
    }
    std::istream::seekg((long)local_228,_S_beg);
    do {
      puVar7 = (ushort *)operator_new__(2);
      std::istream::read((char *)local_228,(long)puVar7);
      uVar5 = (uint)(ushort)(*puVar7 << 8 | *puVar7 >> 8);
      std::istream::seekg((long)local_228,~_S_cur);
      __ptr = operator_new__((ulong)uVar5);
      std::istream::read((char *)local_228,(long)__ptr);
      sVar1 = CONCAT11(*(undefined1 *)((long)__ptr + 2),*(undefined1 *)((long)__ptr + 3));
      if (sVar1 == 0x502) {
        strName.field_2._M_local_buf[0xf] = '\x01';
        strName.field_2._M_local_buf[0xe] = '\x01';
      }
      if (((strName.field_2._M_local_buf[0xf] & 1U) != 0) && (sVar1 == 0x606)) {
        std::__cxx11::string::operator=((string *)local_270,"");
        for (local_271 = 4; local_271 < uVar5; local_271 = local_271 + 1) {
          std::operator+(&local_298,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_270,*(char *)((long)__ptr + (ulong)local_271));
          std::__cxx11::string::operator=((string *)local_270,(string *)&local_298);
          std::__cxx11::string::~string((string *)&local_298);
        }
        local_2a0._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_,
                    (key_type *)local_270);
        local_2a8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_);
        bVar3 = std::operator!=(&local_2a0,&local_2a8);
        if (bVar3) {
          poVar6 = std::operator<<((ostream *)&std::cout,"Structure: \"");
          poVar6 = std::operator<<(poVar6,(string *)local_270);
          poVar6 = std::operator<<(poVar6,"\"");
          poVar6 = std::operator<<(poVar6," already copied.");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          strName.field_2._M_local_buf[0xf] = '\0';
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cout,"Structure: \"");
          poVar6 = std::operator<<(poVar6,(string *)local_270);
          poVar6 = std::operator<<(poVar6,"\"");
          poVar6 = std::operator<<(poVar6," copying");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_,
                   (value_type *)local_270);
          arrInt = gsdTime();
          GDSwriteInt(this,0x502,arrInt,0xc);
        }
        strName.field_2._M_local_buf[0xe] = '\0';
      }
      if (((strName.field_2._M_local_buf[0xf] & 1U) != 0) &&
         ((strName.field_2._M_local_buf[0xe] & 1U) == 0)) {
        fwrite(__ptr,1,(ulong)uVar5,(FILE *)this->gdsFile);
      }
      if (sVar1 == 0x700) {
        strName.field_2._M_local_buf[0xf] = '\0';
      }
    } while (sVar1 != 0x400);
    if (__ptr != (void *)0x0) {
      operator_delete__(__ptr);
    }
    std::ifstream::close();
    poVar6 = std::operator<<((ostream *)&std::cout,"Copying GDS binaries of \"");
    poVar6 = std::operator<<(poVar6,(string *)fileName);
    poVar6 = std::operator<<(poVar6,"\" done.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 0;
    std::__cxx11::string::~string((string *)local_270);
  }
  std::ifstream::~ifstream(local_228);
  return this_local._4_4_;
}

Assistant:

int gdsForge::gdsCopyFile(const string &fileName)
{
  cout << "Copying GDS binaries from \"" << fileName << "\"" << endl;

  ifstream gdsFileIn;

  gdsFileIn.open(fileName, ios::in | ios::binary);

  if (!gdsFileIn.is_open()) {
    cout << "FAILED to open GDS file \"" << fileName << "\"" << endl;
    return 1;
  }

  char *readBlk;
  uint32_t sizeBlk;
  uint32_t hexKey;
  bool cpEN = false;
  bool firstLine = true;
  string strName;
  static set<string> StoredStr;

  gdsFileIn.seekg(0, ios::beg);

  do {
    readBlk = new char[2];
    gdsFileIn.read(readBlk, 2); // Get the size of the record
    sizeBlk = (((unsigned char)readBlk[0] << 8) |
               (unsigned char)readBlk[1]); // Interpret the size of the record

    gdsFileIn.seekg(-2, ios::cur);
    readBlk = new char[sizeBlk]; // Reading in the full length of the record
                                 // excluding the size
    gdsFileIn.read(readBlk, sizeBlk);

    hexKey = (((unsigned char)readBlk[2] << 8) | (unsigned char)readBlk[3]);

    if (hexKey == GDS_BGNSTR) { // Beginning of structure
      cpEN = true;
      firstLine = true;
    }

    if (cpEN && hexKey == GDS_STRNAME) { // get the name of the structure
      strName = "";
      for (uint8_t i = 4; i < sizeBlk; i++) {
        strName = strName + readBlk[i];
      }

      if (StoredStr.find(strName) != StoredStr.end()) { // found
        cout << "Structure: \"" << strName << "\""
             << " already copied." << endl;
        cpEN = false;
      } else { // didnt find
        cout << "Structure: \"" << strName << "\""
             << " copying" << endl;
        StoredStr.insert(strName);
        this->GDSwriteInt(GDS_BGNSTR, gsdTime(), 12);
      }

      firstLine = false;
    }

    if (cpEN && !firstLine) { // Write(copy) the GSD record
      fwrite(readBlk, 1, sizeBlk, this->gdsFile);
    }

    if (hexKey == GDS_ENDSTR) { // end of structure
      cpEN = false;
    }

  } while (hexKey != GDS_ENDLIB);

  delete[] readBlk;

  gdsFileIn.close();
  cout << "Copying GDS binaries of \"" << fileName << "\" done." << endl;
  return 0;
}